

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WindowAttach(Parse *pParse,Expr *p,Window *pWin)

{
  Window *in_RDX;
  Expr *in_RSI;
  Parse *in_RDI;
  
  if (in_RSI == (Expr *)0x0) {
    sqlite3WindowDelete((sqlite3 *)0x0,in_RDX);
  }
  else {
    (in_RSI->y).pWin = in_RDX;
    in_RSI->flags = in_RSI->flags | 0x1020000;
    in_RDX->pOwner = in_RSI;
    if (((in_RSI->flags & 4) != 0) && (in_RDX->eFrmType != 0xa7)) {
      sqlite3ErrorMsg(in_RDI,"DISTINCT is not supported for window functions");
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowAttach(Parse *pParse, Expr *p, Window *pWin){
  if( p ){
    assert( p->op==TK_FUNCTION );
    assert( pWin );
    assert( ExprIsFullSize(p) );
    p->y.pWin = pWin;
    ExprSetProperty(p, EP_WinFunc|EP_FullSize);
    pWin->pOwner = p;
    if( (p->flags & EP_Distinct) && pWin->eFrmType!=TK_FILTER ){
      sqlite3ErrorMsg(pParse,
          "DISTINCT is not supported for window functions"
      );
    }
  }else{
    sqlite3WindowDelete(pParse->db, pWin);
  }
}